

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O2

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
::suffix_array(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
               *this,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     begin,
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              end,comm *_comm)

{
  unsigned_long n;
  runtime_error *this_00;
  block_decomposition_buffered<unsigned_long> local_60;
  
  this->_vptr_suffix_array = (_func_int **)&PTR__suffix_array_001b5288;
  mxx::comm::copy(&this->comm,(EVP_PKEY_CTX *)_comm,(EVP_PKEY_CTX *)end._M_current);
  this->p = (this->comm).m_size;
  (this->input_begin)._M_current = begin._M_current;
  (this->input_end)._M_current = end._M_current;
  (this->part)._vptr_block_decomposition_buffered =
       (_func_int **)&PTR__block_decomposition_buffered_001b52b8;
  (this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->local_LCP).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->local_LCP).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->local_LCP).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->local_size = (long)end._M_current - (long)begin._M_current;
  n = mxx::allreduce<unsigned_long,std::plus<unsigned_long>>(&this->local_size,&this->comm);
  this->n = n;
  mxx::partition::block_decomposition_buffered<unsigned_long>::block_decomposition_buffered
            (&local_60,n,(this->comm).m_size,(this->comm).m_rank);
  (this->part).div1mod = local_60.div1mod;
  *(undefined4 *)&(this->part).loc_size = (undefined4)local_60.loc_size;
  *(undefined4 *)((long)&(this->part).loc_size + 4) = local_60.loc_size._4_4_;
  *(undefined4 *)&(this->part).prefix = (undefined4)local_60.prefix;
  *(undefined4 *)((long)&(this->part).prefix + 4) = local_60.prefix._4_4_;
  *(undefined4 *)&(this->part).div = (undefined4)local_60.div;
  *(undefined4 *)((long)&(this->part).div + 4) = local_60.div._4_4_;
  *(undefined4 *)&(this->part).mod = (undefined4)local_60.mod;
  *(undefined4 *)((long)&(this->part).mod + 4) = local_60.mod._4_4_;
  *(undefined4 *)&(this->part).n = (undefined4)local_60.n;
  *(undefined4 *)((long)&(this->part).n + 4) = local_60.n._4_4_;
  (this->part).p = local_60.p;
  (this->part).rank = local_60.rank;
  if ((this->part).loc_size == this->local_size) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"The input string must be equally block decomposed accross all MPI processes.")
  ;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

suffix_array(InputIterator begin, InputIterator end, const mxx::comm& _comm)
        : comm(_comm.copy()), p(comm.size()),
        input_begin(begin), input_end(end)
    {
        // the local size of the input
        local_size = std::distance(begin, end);
        n = mxx::allreduce(local_size, this->comm);
        // get distribution
        part = mxx::partition::block_decomposition_buffered<index_t>(n, comm.size(), comm.rank());

        // assert a block decomposition
        if (part.local_size() != local_size)
            throw std::runtime_error("The input string must be equally block decomposed accross all MPI processes.");

        // get MPI type
        //mpi_index_t = index_mpi_dt.type();
    }